

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_c.hpp
# Opt level: O0

void ExchCXX::kernel_traits<ExchCXX::BuiltinSCAN_C>::eval_exc_vxc_unpolar_impl
               (double rho,double sigma,double lapl,double tau,double *eps,double *vrho,
               double *vsigma,double *vlapl,double *vtau)

{
  undefined8 *in_RCX;
  double *in_RDX;
  double *in_RSI;
  double *in_RDI;
  double *in_R8;
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double y;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double in_XMM1_Qa;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double in_XMM3_Qa;
  double t396;
  double t395;
  double t394;
  double t390;
  double t389;
  double t388;
  double t387;
  double t382;
  double t381;
  double t377;
  double t376;
  double t373;
  double t372;
  double t371;
  double t370;
  double t369;
  double t368;
  double t364;
  double t363;
  double t362;
  double t361;
  double t356;
  double t355;
  double t354;
  double t353;
  double t352;
  double t350;
  double t349;
  double t346;
  double t345;
  double t344;
  double t341;
  double t340;
  double t335;
  double t334;
  double t330;
  double t329;
  double t328;
  double t324;
  double t322;
  double t321;
  double t318;
  double t317;
  double t316;
  double t315;
  double t314;
  double t310;
  double t309;
  double t308;
  double t307;
  double t306;
  double t305;
  double t302;
  double t301;
  double t300;
  double t297;
  double t296;
  double t289;
  double t287;
  double t285;
  double t282;
  double t277;
  double t276;
  double t271;
  double t270;
  double t266;
  double t265;
  double t264;
  double t262;
  double t261;
  double t260;
  double t259;
  double t257;
  double t256;
  double t255;
  double t254;
  double t253;
  double t252;
  double t251;
  double t250;
  double t249;
  double t245;
  double t244;
  double t243;
  double t242;
  double t241;
  double t238;
  double t237;
  double t234;
  double t233;
  double t231;
  double t230;
  double t228;
  double t227;
  double t226;
  double t225;
  double t223;
  double t218;
  double t217;
  double t216;
  double t215;
  double t214;
  double t211;
  double t210;
  double t209;
  double t208;
  double t207;
  double t206;
  double t204;
  double t201;
  double t200;
  double t199;
  double t197;
  double t195;
  double t194;
  double t192;
  double t190;
  double t189;
  double t188;
  double t187;
  double t186;
  double t184;
  double t183;
  double t181;
  double t180;
  double t178;
  double t172;
  double t171;
  double t169;
  double t167;
  double t166;
  double t162;
  double t160;
  double t159;
  double t156;
  double t155;
  double t152;
  double t151;
  double t149;
  double t146;
  double t145;
  double t144;
  double t143;
  double t140;
  double t138;
  double t137;
  double t134;
  double t133;
  double t132;
  double t131;
  double t130;
  double t129;
  double t126;
  double t125;
  double t124;
  double t112;
  double t109;
  double t107;
  double t105;
  double t104;
  double t101;
  double t99;
  double t98;
  double t90;
  double t89;
  double t88;
  double t86;
  double t85;
  double t84;
  double t83;
  double t82;
  double t81;
  double t80;
  double t78;
  double t77;
  double t74;
  double t73;
  double t72;
  double t71;
  double t69;
  double t67;
  double t66;
  double t65;
  double t64;
  double t63;
  double t60;
  double t59;
  double t58;
  double t55;
  double t54;
  double t51;
  double t46;
  double t44;
  double t39;
  double t37;
  double t35;
  double t34;
  double t33;
  double t31;
  double t30;
  double t27;
  double t25;
  double t22;
  double t17;
  double t14;
  double t13;
  double t11;
  double t8;
  double t348;
  double t347;
  double t193;
  double t161;
  double t122;
  double t121;
  double t120;
  double t119;
  double t94;
  double t92;
  double t43;
  double t41;
  double t21;
  double t20;
  double t19;
  double t7;
  double t5;
  double t118;
  double t116;
  double t61;
  double t40;
  double t6;
  double t4;
  double t2;
  double in_stack_fffffffffffff830;
  double dVar52;
  
  dVar1 = safe_math::cbrt<double>(1.01189733144439e-317);
  dVar2 = 2.4814019635975995 / dVar1;
  dVar3 = dVar2 * 0.053425 + 1.0;
  dVar4 = safe_math::sqrt<double>(1.01194723207462e-317);
  dVar5 = pow_3_2<double>(in_stack_fffffffffffff830);
  dVar6 = dVar1 * dVar1;
  dVar7 = (1.5393389262365056 / dVar6) * 0.123235 +
          dVar5 * 0.204775 + dVar4 * 3.79785 + dVar2 * 0.8969;
  dVar8 = safe_math::log<double>(1.01206729002656e-317);
  dVar9 = dVar3 * 0.0621814 * dVar8;
  dVar52 = 1e-15;
  dVar10 = safe_math::cbrt<double>(1.01210829747517e-317);
  dVar11 = piecewise_functor_3<double>(false,dVar10 * dVar52,1.0);
  dVar11 = dVar11 + dVar11 + -2.0;
  dVar12 = dVar11 * 1.9236610509315362;
  dVar13 = dVar2 * 0.0278125 + 1.0;
  dVar14 = (1.5393389262365056 / dVar6) * 0.1241775 +
           dVar5 * 0.1100325 + dVar4 * 5.1785 + dVar2 * 0.905775;
  dVar15 = safe_math::log<double>(1.01226195189103e-317);
  dVar16 = dVar12 * 0.0197516734986138 * dVar13 * dVar15;
  dVar17 = safe_math::log<double>(1.0123004890114e-317);
  dVar17 = 1.0 - dVar17;
  dVar10 = piecewise_functor_3<double>(false,dVar10 * dVar10,1.0);
  dVar46 = dVar10 * dVar10;
  dVar47 = dVar46 * dVar10;
  dVar48 = dVar2 * 0.025 + 1.0;
  dVar49 = dVar2 * 0.04445 + 1.0;
  dVar50 = dVar48 * (1.0 / dVar49);
  dVar51 = 1.0 / dVar17;
  dVar18 = safe_math::exp<double>(1.0125257829459e-317);
  dVar19 = dVar18 - 1.0;
  dVar20 = dVar51 * (1.0 / dVar19);
  dVar21 = dVar50 * dVar20 * in_XMM1_Qa;
  dVar22 = in_XMM0_Qa * in_XMM0_Qa;
  dVar23 = (1.0 / dVar1) / dVar22;
  dVar24 = dVar23 * 1.2599210498948732;
  dVar25 = 1.0 / dVar46;
  dVar26 = pow_1_4<double>(dVar52);
  dVar27 = 1.0 - 1.0 / dVar26;
  dVar28 = safe_math::log<double>(1.01274910061782e-317);
  dVar28 = (dVar17 / 9.869604401089358) * dVar47 * dVar28;
  dVar29 = (1.0 / dVar6) / in_XMM0_Qa;
  dVar30 = (1.0 / dVar6) / dVar22;
  dVar31 = (in_XMM3_Qa * dVar29 + in_XMM1_Qa * dVar30 * -0.125) * 0.5555555555555556 *
           1.8171205928321397 * 0.34500085141213216;
  dVar5 = (double)(-(ulong)(dVar31 <= 1.0) & 0x3ff0000000000000);
  dVar32 = safe_math::log<double>(1.01288990932689e-317);
  dVar32 = dVar32 / (0.64 - dVar32);
  dVar33 = (double)(-(ulong)(-dVar32 < dVar31) & 0x3ff0000000000000);
  dVar34 = (double)(-(ulong)(dVar31 < -dVar32) & 0x3ff0000000000000);
  dVar35 = piecewise_functor_3<double>((bool)(-(dVar34 != 0.0) & 1),dVar31,-dVar32);
  dVar45 = 1.0 - dVar35;
  dVar32 = 1.0 / dVar45;
  y = safe_math::exp<double>(1.0130366468237e-317);
  dVar36 = piecewise_functor_3<double>((bool)(-(dVar33 != 0.0) & 1),0.0,y);
  dVar37 = safe_math::log<double>(1.01307666614102e-317);
  dVar37 = (1.5 - dVar37) / dVar37;
  dVar38 = (double)(-(ulong)(dVar31 < -dVar37) & 0x3ff0000000000000);
  dVar31 = piecewise_functor_3<double>(dVar38 != 0.0,-dVar37,dVar31);
  dVar37 = safe_math::exp<double>(1.01318832497698e-317);
  dVar39 = piecewise_functor_3<double>(dVar38 != 0.0,0.0,dVar37 * -0.7);
  dVar36 = piecewise_functor_3<double>(dVar5 != 0.0,dVar36,dVar39);
  dVar2 = dVar2 * 0.03138525 + dVar4 * 0.04445 + 1.0;
  dVar39 = safe_math::exp<double>(1.01331184138844e-317);
  dVar52 = pow_1_4<double>(dVar52);
  dVar40 = 1.0 - 1.0 / dVar52;
  dVar41 = safe_math::log<double>(1.01342745274956e-317);
  dVar11 = -(dVar11 * 0.6141934409015853) * 1.9236610509315362 + 1.0;
  dVar41 = ((((1.0 / dVar2) * -0.0285764 + dVar41 * 0.0285764) * dVar11 + dVar9) - dVar16) - dVar28;
  dVar42 = (1.0 / dVar1) / in_XMM0_Qa;
  dVar8 = dVar42 * 2.519842099789747 * 0.9847450218426962 * dVar8 * 0.0011073470983333333;
  dVar4 = (1.0 / dVar4) * 1.4422495703074083 * dVar42 * 1.720508027656199;
  dVar43 = dVar42 * 2.519842099789747 * 0.9847450218426962;
  dVar44 = safe_math::sqrt<double>(1.01369276600138e-317);
  dVar44 = dVar44 * 1.4422495703074083 * dVar42 * 1.720508027656199;
  dVar3 = dVar3 * (1.0 / (dVar7 * dVar7)) *
          (dVar29 * 1.5393389262365056 * -0.08215666666666667 +
          dVar44 * -0.1023875 + dVar4 * -0.632975 + -(dVar43 * 0.29896666666666666)) *
          (1.0 / (16.081979498692537 / dVar7 + 1.0)) * 1.0;
  dVar7 = dVar12 * 1.4422495703074083 * 1.720508027656199 * dVar42 * dVar15 * 0.00018311447306006544
  ;
  dVar12 = dVar12 * dVar13 *
           (1.0 / (dVar14 * dVar14)) *
           (dVar29 * 1.5393389262365056 * -0.082785 +
           dVar44 * -0.05501625 + dVar4 * -0.8630833333333333 + -(dVar43 * 0.301925)) *
           (1.0 / (29.608749977793437 / dVar14 + 1.0)) * 0.5848223622634646;
  dVar13 = (1.0 / dVar26) /
           (dVar21 * 0.027439371595564633 * dVar24 * dVar25 * 4.83597586204941 + 1.0);
  dVar6 = (1.0 / dVar6) / (dVar22 * in_XMM0_Qa);
  dVar14 = in_XMM1_Qa * dVar6;
  dVar15 = ((dVar8 + dVar3) - dVar7) - dVar12;
  dVar26 = 1.0 / (dVar27 * dVar19 + 1.0);
  dVar1 = (dVar17 / 9.869604401089358) * dVar47 *
          (dVar13 * (-(dVar21 * 0.0640252003896508 *
                       ((1.0 / dVar1) / (dVar22 * in_XMM0_Qa)) * 1.2599210498948732 * dVar25) *
                     4.83597586204941 +
                    dVar50 * (1.0 / (dVar17 * dVar17)) *
                    (1.0 / (dVar19 * dVar19)) * in_XMM1_Qa * dVar24 * 0.027439371595564633 *
                    ((1.0 / (dVar46 * dVar46)) / dVar10) * 2.080083823051904 * 1.4645918875615236 *
                    dVar15 * 1.5874010519681996 * dVar18 * 9.869604401089358 +
                    dVar6 * (1.0 / dVar49) * -0.002743937159556463 * dVar51 *
                    (1.0 / dVar19) * in_XMM1_Qa * dVar25 * 1.2599210498948732 +
                    dVar48 * (1.0 / (dVar49 * dVar49)) * dVar20 * 0.004878720269691391 * dVar14 *
                    dVar25 * 1.2599210498948732) * 0.25 * dVar19 +
          -(dVar27 * 1.0 * dVar15 * dVar51 * (1.0 / dVar47) * 9.869604401089358 * dVar18)) * dVar26;
  dVar6 = (in_XMM3_Qa * -1.6666666666666667 * dVar30 + dVar14 / 3.0) * 0.5555555555555556 *
          1.8171205928321397 * 0.34500085141213216;
  dVar15 = piecewise_functor_3<double>(dVar34 != 0.0,dVar6,0.0);
  dVar35 = dVar35 * (1.0 / (dVar45 * dVar45));
  dVar15 = piecewise_functor_3<double>
                     (dVar33 != 0.0,0.0,(dVar15 * -0.64 * dVar32 + -(dVar35 * 0.64 * dVar15)) * y);
  dVar17 = 1.0 / ((1.0 - dVar31) * (1.0 - dVar31));
  dVar6 = piecewise_functor_3<double>(dVar38 != 0.0,0.0,dVar6);
  dVar6 = piecewise_functor_3<double>(dVar38 != 0.0,0.0,dVar17 * -1.05 * dVar6 * dVar37);
  dVar6 = piecewise_functor_3<double>(dVar5 != 0.0,dVar15,dVar6);
  dVar2 = (1.0 / (dVar2 * dVar2)) * (dVar4 * -0.007408333333333334 + -(dVar43 * 0.01046175));
  dVar4 = (dVar39 - 1.0) *
          ((1.0 / dVar52) / (in_XMM1_Qa * 1.5874010519681996 * 0.00842681926885735 * dVar30 + 1.0));
  dVar15 = 1.0 / ((dVar39 - 1.0) * dVar40 + 1.0);
  dVar10 = dVar10 * dVar13 * dVar50 * dVar23 * 0.0006950474021161377 *
           dVar26 * 2.3248947030192535 * 2.620741394208897;
  dVar13 = dVar30 * 1.8171205928321397 * 0.34500085141213216 * 0.06944444444444445;
  dVar18 = piecewise_functor_3<double>(dVar34 != 0.0,-dVar13,0.0);
  dVar18 = piecewise_functor_3<double>
                     (dVar33 != 0.0,0.0,(dVar18 * -0.64 * dVar32 + -(dVar35 * 0.64 * dVar18)) * y);
  dVar13 = piecewise_functor_3<double>(dVar38 != 0.0,0.0,-dVar13);
  dVar13 = piecewise_functor_3<double>(dVar38 != 0.0,0.0,dVar17 * -1.05 * dVar13 * dVar37);
  dVar13 = piecewise_functor_3<double>(dVar5 != 0.0,dVar18,dVar13);
  dVar18 = dVar29 * 0.5555555555555556 * 1.8171205928321397 * 0.34500085141213216;
  dVar19 = piecewise_functor_3<double>(dVar34 != 0.0,dVar18,0.0);
  dVar19 = piecewise_functor_3<double>
                     (dVar33 != 0.0,0.0,(dVar19 * -0.64 * dVar32 + -(dVar35 * 0.64 * dVar19)) * y);
  dVar18 = piecewise_functor_3<double>(dVar38 != 0.0,0.0,dVar18);
  dVar17 = piecewise_functor_3<double>(dVar38 != 0.0,0.0,dVar17 * -1.05 * dVar18 * dVar37);
  dVar5 = piecewise_functor_3<double>(dVar5 != 0.0,dVar19,dVar17);
  *in_RDI = -dVar9 + dVar16 + dVar28 + dVar36 * dVar41;
  *in_RSI = in_XMM0_Qa *
            ((((dVar8 + dVar3) - dVar7) - dVar12) + dVar1 + dVar6 * dVar41 +
            dVar36 * (((((dVar2 * 0.0285764 +
                         (dVar2 * -1.0 * dVar39 * dVar40 +
                         -(dVar4 * 1.8171205928321397 * 0.014225094736250906 * 0.34500085141213216 *
                          dVar14)) * 0.0285764 * dVar15) * dVar11 + -dVar8) - dVar3) + dVar7 +
                      dVar12) - dVar1)) + -dVar9 + dVar16 + dVar28 + dVar36 * dVar41;
  *in_RDX = in_XMM0_Qa *
            (dVar10 + dVar13 * dVar41 +
            dVar36 * (dVar4 * dVar30 * 1.8171205928321397 * 0.00015243824895787514 *
                      dVar15 * dVar11 * 0.34500085141213216 + -dVar10));
  *in_RCX = 0;
  *in_R8 = in_XMM0_Qa * dVar5 * dVar41;
  return;
}

Assistant:

BUILTIN_KERNEL_EVAL_RETURN
    eval_exc_vxc_unpolar_impl( double rho, double sigma, double lapl, double tau, double& eps, double& vrho, double& vsigma, double& vlapl, double& vtau ) {

    (void)(lapl);
    (void)(eps);
    constexpr double t2 = constants::m_cbrt_3;
    constexpr double t4 = constants::m_cbrt_one_ov_pi;
    constexpr double t6 = constants::m_cbrt_4;
    constexpr double t40 = constants::m_cbrt_2;
    constexpr double t61 = constants::m_pi_sq;
    constexpr double t116 = constants::m_cbrt_6;
    constexpr double t118 = constants::m_cbrt_pi_sq;
    constexpr double t5 = t2 * t4;
    constexpr double t7 = t6 * t6;
    constexpr double t19 = t2 * t2;
    constexpr double t20 = t4 * t4;
    constexpr double t21 = t19 * t20;
    constexpr double t41 = t40 - 0.1e1;
    constexpr double t43 = 0.1e1 / t41 / 0.2e1;
    constexpr double t92 = 0.1e1 / t4;
    constexpr double t94 = t19 * t92 * t6;
    constexpr double t119 = t118 * t118;
    constexpr double t120 = 0.1e1 / t119;
    constexpr double t121 = t40 * t40;
    constexpr double t122 = t120 * t121;
    constexpr double t161 = t116 * t120;
    constexpr double t193 = t4 * t7;
    constexpr double t347 = t40 * t19;
    constexpr double t348 = t92 * t6;


    const double t8 = safe_math::cbrt( rho );
    const double t11 = t5 * t7 / t8;
    const double t13 = 0.1e1 + 0.53425e-1 * t11;
    const double t14 = safe_math::sqrt( t11 );
    const double t17 = pow_3_2( t11 );
    const double t22 = t8 * t8;
    const double t25 = t21 * t6 / t22;
    const double t27 = 0.379785e1 * t14 + 0.8969e0 * t11 + 0.204775e0 * t17 + 0.123235e0 * t25;
    const double t30 = 0.1e1 + 0.16081979498692535067e2 / t27;
    const double t31 = safe_math::log( t30 );
    const double t33 = 0.621814e-1 * t13 * t31;
    const double t34 = 0.1e1 <= zeta_tol;
    const double t35 = safe_math::cbrt( zeta_tol );
    const double t37 = piecewise_functor_3( t34, t35 * zeta_tol, 1.0 );
    const double t39 = 0.2e1 * t37 - 0.2e1;
    const double t44 = t39 * t43;
    const double t46 = 0.1e1 + 0.278125e-1 * t11;
    const double t51 = 0.51785e1 * t14 + 0.905775e0 * t11 + 0.1100325e0 * t17 + 0.1241775e0 * t25;
    const double t54 = 0.1e1 + 0.29608749977793437516e2 / t51;
    const double t55 = safe_math::log( t54 );
    const double t58 = 0.19751673498613801407e-1 * t44 * t46 * t55;
    const double t59 = safe_math::log( 0.2e1 );
    const double t60 = 0.1e1 - t59;
    const double t63 = t60 / t61;
    const double t64 = t35 * t35;
    const double t65 = piecewise_functor_3( t34, t64, 1.0 );
    const double t66 = t65 * t65;
    const double t67 = t66 * t65;
    const double t69 = 0.1e1 + 0.25e-1 * t11;
    const double t71 = 0.1e1 + 0.4445e-1 * t11;
    const double t72 = 0.1e1 / t71;
    const double t73 = t69 * t72;
    const double t74 = 0.1e1 / t60;
    const double t77 = 0.1e1 / t67;
    const double t78 = t61 * t77;
    const double t80 = safe_math::exp( -( -t33 + t58 ) * t74 * t78 );
    const double t81 = t80 - 0.1e1;
    const double t82 = 0.1e1 / t81;
    const double t83 = t74 * t82;
    const double t84 = t83 * sigma;
    const double t85 = t73 * t84;
    const double t86 = rho * rho;
    const double t88 = 0.1e1 / t8 / t86;
    const double t89 = t88 * t40;
    const double t90 = 0.1e1 / t66;
    const double t98 = 0.1e1 + 0.27439371595564631661e-1 * t85 * t89 * t90 * t94;
    const double t99 = pow_1_4( t98 );
    const double t101 = 0.1e1 - 0.1e1 / t99;
    const double t104 = 0.1e1 + 0.1e1 * t101 * t81;
    const double t105 = safe_math::log( t104 );
    const double t107 = t63 * t67 * t105;
    const double t109 = 0.1e1 / t22 / rho;
    const double t112 = 0.1e1 / t22 / t86;
    const double t124 = 0.5e1 / 0.9e1 * ( tau * t109 - sigma * t112 / 0.8e1 ) * t116 * t122;
    const double t125 = t124 <= 0.1e1;
    const double t126 = safe_math::log( DBL_EPSILON );
    const double t129 = t126 / ( -t126 + 0.64e0 );
    const double t130 = -t129 < t124;
    const double t131 = t124 < -t129;
    const double t132 = piecewise_functor_3( t131, t124, -t129 );
    const double t133 = 0.1e1 - t132;
    const double t134 = 0.1e1 / t133;
    const double t137 = safe_math::exp( -0.64e0 * t132 * t134 );
    const double t138 = piecewise_functor_3( t130, 0.0, t137 );
    const double t140 = safe_math::log( 0.14285714285714285714e1 * DBL_EPSILON );
    const double t143 = ( -t140 + 0.15e1 ) / t140;
    const double t144 = t124 < -t143;
    const double t145 = piecewise_functor_3( t144, -t143, t124 );
    const double t146 = 0.1e1 - t145;
    const double t149 = safe_math::exp( 0.15e1 / t146 );
    const double t151 = piecewise_functor_3( t144, 0.0, -0.7e0 * t149 );
    const double t152 = piecewise_functor_3( t125, t138, t151 );
    const double t155 = 0.1e1 + 0.4445e-1 * t14 + 0.3138525e-1 * t11;
    const double t156 = 0.1e1 / t155;
    const double t159 = safe_math::exp( 0.1e1 * t156 );
    const double t160 = t159 - 0.1e1;
    const double t162 = t121 * sigma;
    const double t166 = 0.1e1 + 0.21337642104376358333e-1 * t161 * t162 * t112;
    const double t167 = pow_1_4( t166 );
    const double t169 = 0.1e1 - 0.1e1 / t167;
    const double t171 = t160 * t169 + 0.1e1;
    const double t172 = safe_math::log( t171 );
    const double t178 = 0.1e1 - 0.2363e1 * t41 * t39 * t43;
    const double t180 = ( -0.285764e-1 * t156 + 0.285764e-1 * t172 ) * t178 + t33 - t58 - t107;
    const double t181 = t152 * t180;
    const double t183 = 0.1e1 / t8 / rho;
    const double t184 = t7 * t183;
    const double t186 = t5 * t184 * t31;
    const double t187 = 0.11073470983333333333e-2 * t186;
    const double t188 = t27 * t27;
    const double t189 = 0.1e1 / t188;
    const double t190 = t13 * t189;
    const double t192 = 0.1e1 / t14 * t2;
    const double t194 = t193 * t183;
    const double t195 = t192 * t194;
    const double t197 = t5 * t184;
    const double t199 = safe_math::sqrt( t11 );
    const double t200 = t199 * t2;
    const double t201 = t200 * t194;
    const double t204 = t21 * t6 * t109;
    const double t206 = -0.632975e0 * t195 - 0.29896666666666666667e0 * t197 - 0.1023875e0 * t201 - 0.82156666666666666667e-1 * t204;
    const double t207 = 0.1e1 / t30;
    const double t208 = t206 * t207;
    const double t209 = t190 * t208;
    const double t210 = 0.1e1 * t209;
    const double t211 = t44 * t2;
    const double t214 = t211 * t193 * t183 * t55;
    const double t215 = 0.18311447306006545054e-3 * t214;
    const double t216 = t44 * t46;
    const double t217 = t51 * t51;
    const double t218 = 0.1e1 / t217;
    const double t223 = -0.86308333333333333334e0 * t195 - 0.301925e0 * t197 - 0.5501625e-1 * t201 - 0.82785e-1 * t204;
    const double t225 = 0.1e1 / t54;
    const double t226 = t218 * t223 * t225;
    const double t227 = t216 * t226;
    const double t228 = 0.5848223622634646207e0 * t227;
    const double t230 = 0.1e1 / t99 / t98;
    const double t231 = t86 * rho;
    const double t233 = 0.1e1 / t22 / t231;
    const double t234 = t233 * t72;
    const double t237 = t40 * t90;
    const double t238 = t82 * sigma * t237;
    const double t241 = t71 * t71;
    const double t242 = 0.1e1 / t241;
    const double t243 = t69 * t242;
    const double t244 = t243 * t83;
    const double t245 = sigma * t233;
    const double t249 = t60 * t60;
    const double t250 = 0.1e1 / t249;
    const double t251 = t73 * t250;
    const double t252 = t81 * t81;
    const double t253 = 0.1e1 / t252;
    const double t254 = t253 * sigma;
    const double t255 = t254 * t89;
    const double t256 = t251 * t255;
    const double t257 = t66 * t66;
    const double t259 = 0.1e1 / t257 / t65;
    const double t260 = t259 * t19;
    const double t261 = t260 * t92;
    const double t262 = t187 + t210 - t215 - t228;
    const double t264 = t61 * t80;
    const double t265 = t6 * t262 * t264;
    const double t266 = t261 * t265;
    const double t270 = 0.1e1 / t8 / t231;
    const double t271 = t270 * t40;
    const double t276 = -0.27439371595564631661e-2 * t234 * t74 * t238 + 0.48787202696913915093e-2 * t244 * t245 * t237 + 0.27439371595564631661e-1 * t256 * t266 - 0.64025200389650807209e-1 * t85 * t271 * t90 * t94;
    const double t277 = t230 * t276;
    const double t282 = t78 * t80;
    const double t285 = 0.25e0 * t277 * t81 - 0.1e1 * t101 * t262 * t74 * t282;
    const double t287 = 0.1e1 / t104;
    const double t289 = t63 * t67 * t285 * t287;
    const double t296 = 0.5e1 / 0.9e1 * ( -0.5e1 / 0.3e1 * tau * t112 + t245 / 0.3e1 ) * t116 * t122;
    const double t297 = piecewise_functor_3( t131, t296, 0.0 );
    const double t300 = t133 * t133;
    const double t301 = 0.1e1 / t300;
    const double t302 = t132 * t301;
    const double t305 = -0.64e0 * t297 * t134 - 0.64e0 * t302 * t297;
    const double t306 = t305 * t137;
    const double t307 = piecewise_functor_3( t130, 0.0, t306 );
    const double t308 = t146 * t146;
    const double t309 = 0.1e1 / t308;
    const double t310 = piecewise_functor_3( t144, 0.0, t296 );
    const double t314 = piecewise_functor_3( t144, 0.0, -0.105e1 * t309 * t310 * t149 );
    const double t315 = piecewise_functor_3( t125, t307, t314 );
    const double t316 = t315 * t180;
    const double t317 = t155 * t155;
    const double t318 = 0.1e1 / t317;
    const double t321 = -0.74083333333333333333e-2 * t195 - 0.1046175e-1 * t197;
    const double t322 = t318 * t321;
    const double t324 = t159 * t169;
    const double t328 = 0.1e1 / t167 / t166;
    const double t329 = t160 * t328;
    const double t330 = t329 * t116;
    const double t334 = -0.1e1 * t322 * t324 - 0.14225094736250905555e-1 * t330 * t122 * t245;
    const double t335 = 0.1e1 / t171;
    const double t340 = ( 0.285764e-1 * t322 + 0.285764e-1 * t334 * t335 ) * t178 - t187 - t210 + t215 + t228 - t289;
    const double t341 = t152 * t340;
    const double t344 = t65 * t230;
    const double t345 = t73 * t88;
    const double t346 = t344 * t345;
    const double t349 = t348 * t287;
    const double t350 = t347 * t349;
    const double t352 = 0.69504740211613770831e-3 * t346 * t350;
    const double t353 = t112 * t116;
    const double t354 = t353 * t122;
    const double t355 = 0.5e1 / 0.72e2 * t354;
    const double t356 = piecewise_functor_3( t131, -t355, 0.0 );
    const double t361 = -0.64e0 * t356 * t134 - 0.64e0 * t302 * t356;
    const double t362 = t361 * t137;
    const double t363 = piecewise_functor_3( t130, 0.0, t362 );
    const double t364 = piecewise_functor_3( t144, 0.0, -t355 );
    const double t368 = piecewise_functor_3( t144, 0.0, -0.105e1 * t309 * t364 * t149 );
    const double t369 = piecewise_functor_3( t125, t363, t368 );
    const double t370 = t369 * t180;
    const double t371 = t329 * t353;
    const double t372 = t335 * t178;
    const double t373 = t122 * t372;
    const double t376 = 0.15243824895787514157e-3 * t371 * t373 - t352;
    const double t377 = t152 * t376;
    const double t381 = 0.5e1 / 0.9e1 * t109 * t116 * t122;
    const double t382 = piecewise_functor_3( t131, t381, 0.0 );
    const double t387 = -0.64e0 * t382 * t134 - 0.64e0 * t302 * t382;
    const double t388 = t387 * t137;
    const double t389 = piecewise_functor_3( t130, 0.0, t388 );
    const double t390 = piecewise_functor_3( t144, 0.0, t381 );
    const double t394 = piecewise_functor_3( t144, 0.0, -0.105e1 * t309 * t390 * t149 );
    const double t395 = piecewise_functor_3( t125, t389, t394 );
    const double t396 = rho * t395;


    eps = -t33 + t58 + t107 + t181;
    vrho = -t33 + t58 + t107 + t181 + rho * ( t187 + t210 - t215 - t228 + t289 + t316 + t341 );
    vsigma = rho * ( t352 + t370 + t377 );
    vlapl = 0.e0;
    vtau = t396 * t180;

  }